

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

void __thiscall despot::TagPOMCPPrior::ComputePreference(TagPOMCPPrior *this,State *state)

{
  iterator iVar1;
  BaseTag *pBVar2;
  bool bVar3;
  char cVar4;
  undefined8 uVar5;
  Coord rob;
  int local_3c;
  undefined8 local_38;
  
  local_38 = despot::Floor::GetCell((int)this->tag_model_ + 0x58);
  if (*(long *)&this->field_0x68 != *(long *)&this->field_0x60) {
    *(long *)&this->field_0x68 = *(long *)&this->field_0x60;
  }
  if (*(long *)&this->field_0x50 != *(long *)&this->field_0x48) {
    *(long *)&this->field_0x50 = *(long *)&this->field_0x48;
  }
  local_3c = 0;
  do {
    iVar1._M_current = *(int **)&this->field_0x68;
    if (iVar1._M_current == *(int **)&this->field_0x70) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&this->field_0x60,iVar1,&local_3c);
    }
    else {
      *iVar1._M_current = local_3c;
      *(int **)&this->field_0x68 = iVar1._M_current + 1;
    }
    bVar3 = local_3c < 4;
    local_3c = local_3c + 1;
  } while (bVar3);
  if (*(long *)&this->field_0x18 != *(long *)&this->field_0x10) {
    if (*(OBS_TYPE *)(*(long *)&this->field_0x30 + -8) == this->tag_model_->same_loc_obs_) {
      local_3c = 4;
      iVar1._M_current = *(int **)&this->field_0x50;
      if (iVar1._M_current == *(int **)&this->field_0x58) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)&this->field_0x48,iVar1,&local_3c);
      }
      else {
        *iVar1._M_current = 4;
        *(int **)&this->field_0x50 = iVar1._M_current + 1;
      }
    }
    else if (this->tag_model_->robot_pos_unknown_ == true) {
      local_3c = 0;
      do {
        pBVar2 = this->tag_model_;
        uVar5 = despot::operator+((Coord *)&local_38,(Coord *)(&Compass::DIRECTIONS + local_3c));
        cVar4 = despot::Floor::Inside(&pBVar2->floor_,uVar5);
        if ((cVar4 != '\0') &&
           (cVar4 = despot::Compass::Opposite(local_3c,*(int *)(*(long *)&this->field_0x18 + -4)),
           cVar4 == '\0')) {
          iVar1._M_current = *(int **)&this->field_0x50;
          if (iVar1._M_current == *(int **)&this->field_0x58) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&this->field_0x48,iVar1,&local_3c);
          }
          else {
            *iVar1._M_current = local_3c;
            *(int **)&this->field_0x50 = iVar1._M_current + 1;
          }
        }
        bVar3 = local_3c < 3;
        local_3c = local_3c + 1;
      } while (bVar3);
    }
  }
  return;
}

Assistant:

void ComputePreference(const State& state) {
		Coord rob = tag_model_->GetRobPos(&state);

		legal_actions_.clear();
		preferred_actions_.clear();

		for (int a = 0; a < 5; a++) {
			legal_actions_.push_back(a);
		}

		if (history_.Size() != 0) {
			if (history_.LastObservation() == tag_model_->same_loc_obs_) {
				preferred_actions_.push_back(tag_model_->TagAction());
			} else {
				if (tag_model_->robot_pos_unknown_) {
					for (int a = 0; a < 4; a++) {
						if (tag_model_->floor_.Inside(
							rob + Compass::DIRECTIONS[a])) {
							if (!Compass::Opposite(a, history_.LastAction()))
								preferred_actions_.push_back(a);
						}
					}
				}
			}
		}
	}